

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManDeriveReason(Cbs2_Man_t *p,int Level)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int *piVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  
  piVar9 = (p->pClauses).pData;
  lVar17 = (long)(p->pClauses).iHead;
  if (piVar9[lVar17] != 0) {
    __assert_fail("pQue->pData[pQue->iHead] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x2d4,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  if (piVar9[lVar17 + 1] != 0) {
    __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x2d5,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  uVar18 = lVar17 + 2;
  iVar7 = (int)uVar18;
  if ((p->pClauses).iTail <= iVar7) {
    __assert_fail("pQue->iHead + 2 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x2d6,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  if (iVar7 < (p->pClauses).iTail) {
    uVar13 = uVar18 & 0xffffffff;
    do {
      uVar2 = (p->pClauses).pData[uVar18];
      uVar15 = (ulong)uVar2;
      if (((int)uVar2 < 0) || ((p->vMark).nSize <= (int)uVar2)) goto LAB_0071fa25;
      pcVar5 = (p->vMark).pArray;
      if (pcVar5[uVar15] == '\0') {
        pcVar5[uVar15] = '\x01';
        Vec_IntPush(p->vTemp,uVar2);
        iVar7 = (p->vLevReason).nSize;
        if (iVar7 <= (int)(uVar2 * 3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar9 = (p->vLevReason).pArray;
        iVar3 = piVar9[uVar15 * 3];
        if (iVar3 == -1) {
          __assert_fail("!Cbs2_VarUnused(p, iVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x8f,"int Cbs2_VarDecLevel(Cbs2_Man_t *, int)");
        }
        iVar12 = (int)uVar13;
        if (iVar3 < Level) {
          uVar13 = (ulong)(iVar12 + 1);
          (p->pClauses).pData[iVar12] = uVar2;
        }
        else {
          if (iVar3 != Level) {
            __assert_fail("iLitLevel == Level",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x2ed,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
          }
          uVar11 = uVar2 * 3 + 1;
          if (iVar7 <= (int)uVar11) goto LAB_0071faa1;
          iVar7 = piVar9[uVar11];
          if (iVar7 == 0) {
            if (piVar9[(ulong)uVar11 + 1] == 0) {
              piVar9 = (p->pClauses).pData;
              lVar17 = (long)(p->pClauses).iHead;
              if (piVar9[lVar17 + 1] != 0) {
                __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                              ,0x2f1,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
              }
              piVar9[lVar17 + 1] = uVar2;
            }
            else {
              if ((long)piVar9[(ulong)uVar11 + 1] == 0) {
                __assert_fail("pReason[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                              ,0x2fd,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
              }
              uVar4 = (p->pClauses).pData[piVar9[(ulong)uVar11 + 1]];
              iVar7 = (p->pClauses).nSize;
              if (iVar7 < (int)((p->pClauses).iTail + uVar4)) {
                (p->pClauses).nSize = iVar7 * 2;
                piVar8 = (p->pClauses).pData;
                if (piVar8 == (int *)0x0) {
                  piVar8 = (int *)malloc((long)iVar7 << 3);
                }
                else {
                  piVar8 = (int *)realloc(piVar8,(long)iVar7 << 3);
                }
                (p->pClauses).pData = piVar8;
              }
              if ((p->pClauses).nSize < (int)((p->pClauses).iTail + uVar4)) {
                __assert_fail("p->iTail + Plus <= p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                              ,0x180,"void Cbs2_QueGrow(Cbs2_Que_t *, int)");
              }
              iVar7 = piVar9[(ulong)uVar11 + 1];
              piVar9 = (p->pClauses).pData;
              uVar11 = piVar9[(long)iVar7 + 1];
              if ((int)uVar11 < 0) {
LAB_0071fa82:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              if (uVar2 != uVar11 >> 1) {
                __assert_fail("iObj == Abc_Lit2Var(pLits[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                              ,0x300,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
              }
              if (1 < (int)uVar4) {
                lVar17 = 0;
                do {
                  uVar2 = piVar9[(long)iVar7 + lVar17 + 2];
                  if ((int)uVar2 < 0) goto LAB_0071fa82;
                  iVar3 = (p->pClauses).nSize;
                  if ((p->pClauses).iTail == iVar3) {
                    (p->pClauses).nSize = iVar3 * 2;
                    piVar8 = (p->pClauses).pData;
                    if (piVar8 == (int *)0x0) {
                      piVar8 = (int *)malloc((long)iVar3 << 3);
                    }
                    else {
                      piVar8 = (int *)realloc(piVar8,(long)iVar3 << 3);
                    }
                    (p->pClauses).pData = piVar8;
                  }
                  iVar3 = (p->pClauses).iTail;
                  (p->pClauses).iTail = iVar3 + 1;
                  (p->pClauses).pData[iVar3] = uVar2 >> 1;
                  lVar17 = lVar17 + 1;
                } while ((ulong)uVar4 - 1 != lVar17);
              }
            }
          }
          else {
            iVar3 = (p->pClauses).nSize;
            if ((p->pClauses).iTail == iVar3) {
              (p->pClauses).nSize = iVar3 * 2;
              piVar8 = (p->pClauses).pData;
              if (piVar8 == (int *)0x0) {
                piVar8 = (int *)malloc((long)iVar3 << 3);
              }
              else {
                piVar8 = (int *)realloc(piVar8,(long)iVar3 << 3);
              }
              (p->pClauses).pData = piVar8;
            }
            piVar8 = (p->pClauses).pData;
            iVar3 = (p->pClauses).iTail;
            (p->pClauses).iTail = iVar3 + 1;
            piVar8[iVar3] = iVar7;
            iVar7 = piVar9[(ulong)uVar11 + 1];
            if (iVar7 != 0) {
              iVar3 = (p->pClauses).nSize;
              if ((p->pClauses).iTail == iVar3) {
                (p->pClauses).nSize = iVar3 * 2;
                if (piVar8 == (int *)0x0) {
                  piVar9 = (int *)malloc((long)iVar3 << 3);
                }
                else {
                  piVar9 = (int *)realloc(piVar8,(long)iVar3 << 3);
                }
                (p->pClauses).pData = piVar9;
              }
              iVar3 = (p->pClauses).iTail;
              (p->pClauses).iTail = iVar3 + 1;
              (p->pClauses).pData[iVar3] = iVar7;
            }
          }
        }
      }
      iVar7 = (int)uVar13;
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)(p->pClauses).iTail);
  }
  piVar9 = (p->pClauses).pData;
  lVar17 = (long)(p->pClauses).iHead;
  if (piVar9[lVar17] != 0) {
    __assert_fail("pQue->pData[pQue->iHead] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x305,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  if (piVar9[lVar17 + 1] == 0) {
    __assert_fail("pQue->pData[pQue->iHead+1] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x306,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  (p->pClauses).iTail = iVar7;
  pVVar10 = p->vTemp;
  if (0 < pVVar10->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar10->pArray[lVar17];
      if (((long)iVar7 < 0) || ((p->vMark).nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      (p->vMark).pArray[iVar7] = '\0';
      lVar17 = lVar17 + 1;
      pVVar10 = p->vTemp;
    } while (lVar17 < pVVar10->nSize);
  }
  uVar2 = (p->pClauses).iHead;
  iVar7 = (p->pClauses).iTail;
  if (iVar7 <= (int)(uVar2 + 1)) {
    __assert_fail("pQue->iHead+1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x2ab,"int Cbs2_QueFinish(Cbs2_Man_t *, int)");
  }
  lVar17 = (long)(int)uVar2;
  iVar7 = iVar7 + ~uVar2;
  (p->pClauses).pData[lVar17] = iVar7;
  iVar3 = (p->pClauses).iTail;
  (p->pClauses).iHead = iVar3;
  if (iVar7 == 1) {
    return uVar2;
  }
  lVar16 = (long)iVar3;
  (p->pClauses).iHead = uVar2;
  if ((int)uVar2 < iVar3) {
    lVar14 = 0;
    do {
      piVar9 = (p->pClauses).pData;
      uVar11 = piVar9[lVar17];
      if (((ulong)uVar11 == 0) || (lVar16 == lVar17)) break;
      if (lVar14 != 0) {
        if (((int)uVar11 < 0) || ((p->vAssign).nSize <= (int)uVar11)) {
LAB_0071fa25:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        bVar1 = (p->vAssign).pArray[uVar11];
        if (1 < bVar1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar11 = (uint)bVar1 + uVar11 * 2;
      }
      iVar7 = (p->pClauses).nSize;
      if ((p->pClauses).iTail == iVar7) {
        (p->pClauses).nSize = iVar7 * 2;
        if (piVar9 == (int *)0x0) {
          piVar9 = (int *)malloc((long)iVar7 << 3);
        }
        else {
          piVar9 = (int *)realloc(piVar9,(long)iVar7 << 3);
        }
        (p->pClauses).pData = piVar9;
      }
      iVar7 = (p->pClauses).iTail;
      (p->pClauses).iTail = iVar7 + 1;
      (p->pClauses).pData[iVar7] = uVar11;
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + -4;
    } while (lVar17 < (p->pClauses).iTail);
  }
  iVar7 = (p->pClauses).nSize;
  if ((p->pClauses).iTail == iVar7) {
    (p->pClauses).nSize = iVar7 * 2;
    piVar9 = (p->pClauses).pData;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)iVar7 << 3);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)iVar7 << 3);
    }
    (p->pClauses).pData = piVar9;
  }
  piVar9 = (p->pClauses).pData;
  iVar7 = (p->pClauses).iTail;
  (p->pClauses).iTail = iVar7 + 1;
  piVar9[iVar7] = 0;
  iVar7 = (p->pClauses).nSize;
  if ((p->pClauses).iTail == iVar7) {
    (p->pClauses).nSize = iVar7 * 2;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)iVar7 << 3);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)iVar7 << 3);
    }
    (p->pClauses).pData = piVar9;
  }
  piVar9 = (p->pClauses).pData;
  iVar7 = (p->pClauses).iTail;
  (p->pClauses).iTail = iVar7 + 1;
  piVar9[iVar7] = 0;
  (p->pClauses).iHead = (p->pClauses).iTail;
  uVar11 = piVar9[lVar16 + 1];
  if ((int)uVar11 < 0) {
LAB_0071fbb8:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x131,"int Abc_LitNot(int)");
  }
  uVar18 = (ulong)uVar11 ^ 1;
  if ((p->vWatches).nSize <= (int)uVar18) {
LAB_0071faa1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar8 = (p->vWatches).pArray;
  if (piVar8[uVar18] == 0) {
    Vec_IntPush(&p->vWatchUpds,(int)uVar18);
  }
  if ((piVar9[lVar16 + 1] == uVar11) || (piVar9[lVar16 + 2] == uVar11)) {
    piVar6 = (p->pClauses).pData;
    piVar6[(int)((uint)(piVar9[lVar16 + 2] == uVar11) + iVar3 + 1 + piVar6[lVar16])] =
         piVar8[uVar18];
    piVar8[uVar18] = iVar3;
    uVar11 = piVar6[lVar16 + 2];
    if ((int)uVar11 < 0) goto LAB_0071fbb8;
    uVar18 = (ulong)uVar11 ^ 1;
    if ((p->vWatches).nSize <= (int)uVar18) goto LAB_0071faa1;
    piVar9 = (p->vWatches).pArray;
    if (piVar9[uVar18] == 0) {
      Vec_IntPush(&p->vWatchUpds,(int)uVar18);
    }
    if ((piVar6[lVar16 + 1] == uVar11) || (piVar6[lVar16 + 2] == uVar11)) {
      piVar8 = (p->pClauses).pData;
      piVar8[(int)(iVar3 + 1 + (uint)(piVar6[lVar16 + 2] == uVar11) + piVar8[lVar16])] =
           piVar9[uVar18];
      piVar9[uVar18] = iVar3;
      return uVar2;
    }
  }
  __assert_fail("Lit == pLits[0] || Lit == pLits[1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                ,0x2a3,"void Cbs2_ManWatchClause(Cbs2_Man_t *, int, int)");
}

Assistant:

static inline int Cbs2_ManDeriveReason( Cbs2_Man_t * p, int Level )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, k, iObj, iLitLevel, * pReason;
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] == 0 );
    assert( pQue->iHead + 2 < pQue->iTail );
    //for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
    //    assert( !Cbs2_VarMark0(p, pQue->pData[i]) );
    // compact literals
    Vec_IntClear( p->vTemp );
    for ( i = k = pQue->iHead + 2; i < pQue->iTail; i++ )
    {
        iObj = pQue->pData[i];
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Vec_IntPush( p->vTemp, iObj );
        // check decision level
        iLitLevel = Cbs2_VarDecLevel( p, iObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = iObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs2_VarReasonP( p, iObj );
        if ( pReason[0] == 0 && pReason[1] == 0 ) // no reason
        {
            assert( pQue->pData[pQue->iHead+1] == 0 );
            pQue->pData[pQue->iHead+1] = iObj;
        }
        else if ( pReason[0] != 0 ) // circuit reason
        {
            Cbs2_QuePush( pQue, pReason[0] );
            if ( pReason[1] )
            Cbs2_QuePush( pQue, pReason[1] );
        }
        else // clause reason
        {
            int i, * pLits, nLits = Cbs2_ClauseSize( p, pReason[1] );
            assert( pReason[1] );
            Cbs2_QueGrow( pQue, nLits );
            pLits = Cbs2_ClauseLits( p, pReason[1] );
            assert( iObj == Abc_Lit2Var(pLits[0]) );
            for ( i = 1; i < nLits; i++ )
                Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
        }
    }
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] != 0 );
    pQue->iTail = k;
    // clear the marks
    Vec_IntForEachEntry( p->vTemp, iObj, i )
        Cbs2_VarSetMark0(p, iObj, 0);
    return Cbs2_QueFinish( p, Level );
}